

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

package * lsvm::object::get_package(symbol *name)

{
  bool bVar1;
  package_t *ppVar2;
  
  ppVar2 = packages;
  do {
    bVar1 = symbol::symbol_equals(ppVar2->name,name);
    if (bVar1) {
      return ppVar2;
    }
    ppVar2 = ppVar2->next;
  } while (ppVar2 != (package_t *)0x0);
  return (package *)0x0;
}

Assistant:

package* get_package(symbol* name){
    package* pkg = packages;
    do{
        if(lsvm::symbol::symbol_equals(pkg->name,name)){
            return pkg;
        }
        pkg = pkg->next;
    }while(pkg != null);

    return null;
}